

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

void test_blocking_io_errors(config config)

{
  int iVar1;
  redisContext *prVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  config *pcVar8;
  undefined8 *puVar9;
  byte bVar10;
  config in_stack_ffffffffffffff68;
  void *_reply;
  
  bVar10 = 0;
  pcVar8 = &config;
  puVar9 = (undefined8 *)&stack0xffffffffffffff68;
  for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar9 = *(undefined8 *)pcVar8;
    pcVar8 = (config *)&pcVar8->tcp;
    puVar9 = puVar9 + 1;
  }
  prVar2 = do_connect(in_stack_ffffffffffffff68);
  lVar7 = redisCommand(prVar2,"INFO");
  pcVar3 = strstr(*(char **)(lVar7 + 0x20),"redis_version:");
  lVar4 = strtol(pcVar3 + 0xe,(char **)&_reply,10);
  lVar5 = strtol((char *)((long)_reply + 1),(char **)&_reply,10);
  freeReplyObject(lVar7);
  tests = tests + 1;
  printf("#%02d ");
  printf("Returns I/O error when the connection is lost: ");
  lVar7 = redisCommand(prVar2,"QUIT");
  if (((int)lVar4 < 3) && (((int)lVar4 != 2 || ((int)lVar5 < 1)))) {
    if (lVar7 == 0) {
      puts("\x1b[0;32mPASSED\x1b[0;0m");
    }
    else {
      puts("\x1b[0;31mFAILED\x1b[0;0m");
      fails = fails + 1;
    }
  }
  else {
    iVar1 = strcasecmp(*(char **)(lVar7 + 0x20),"OK");
    if (iVar1 == 0) {
      iVar1 = redisGetReply(prVar2,&_reply);
      if (iVar1 != -1) goto LAB_00104b9b;
      puts("\x1b[0;32mPASSED\x1b[0;0m");
    }
    else {
LAB_00104b9b:
      puts("\x1b[0;31mFAILED\x1b[0;0m");
      fails = fails + 1;
    }
    freeReplyObject(lVar7);
  }
  if (prVar2->err != 3) {
LAB_00104ccf:
    __assert_fail("c->err == REDIS_ERR_EOF && strcmp(c->errstr,\"Server closed the connection\") == 0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                  ,0x2ab,"void test_blocking_io_errors(struct config)");
  }
  iVar1 = strcmp(prVar2->errstr,"Server closed the connection");
  if (iVar1 != 0) goto LAB_00104ccf;
  redisFree(prVar2);
  pcVar8 = &config;
  puVar9 = (undefined8 *)&stack0xffffffffffffff68;
  for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar9 = *(undefined8 *)pcVar8;
    pcVar8 = (config *)((long)pcVar8 + (ulong)bVar10 * -0x10 + 8);
    puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
  }
  prVar2 = do_connect(in_stack_ffffffffffffff68);
  tests = tests + 1;
  printf("#%02d ");
  printf("Returns I/O error on socket timeout: ");
  iVar1 = redisSetTimeout(prVar2,0,1000);
  if (iVar1 != 0) {
    __assert_fail("redisSetTimeout(c,tv) == REDIS_OK",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                  ,0x2b1,"void test_blocking_io_errors(struct config)");
  }
  iVar1 = redisGetReply(prVar2,&_reply);
  if ((iVar1 == -1) && (prVar2->err == 1)) {
    piVar6 = __errno_location();
    if (*piVar6 == 0xb) {
      puts("\x1b[0;32mPASSED\x1b[0;0m");
      goto LAB_00104c7a;
    }
  }
  puts("\x1b[0;31mFAILED\x1b[0;0m");
  fails = fails + 1;
LAB_00104c7a:
  redisFree(prVar2);
  return;
}

Assistant:

static void test_blocking_io_errors(struct config config) {
    redisContext *c;
    redisReply *reply;
    void *_reply;
    int major, minor;

    /* Connect to target given by config. */
    c = do_connect(config);
    {
        /* Find out Redis version to determine the path for the next test */
        const char *field = "redis_version:";
        char *p, *eptr;

        reply = redisCommand(c,"INFO");
        p = strstr(reply->str,field);
        major = strtol(p+strlen(field),&eptr,10);
        p = eptr+1; /* char next to the first "." */
        minor = strtol(p,&eptr,10);
        freeReplyObject(reply);
    }

    test("Returns I/O error when the connection is lost: ");
    reply = redisCommand(c,"QUIT");
    if (major > 2 || (major == 2 && minor > 0)) {
        /* > 2.0 returns OK on QUIT and read() should be issued once more
         * to know the descriptor is at EOF. */
        test_cond(strcasecmp(reply->str,"OK") == 0 &&
            redisGetReply(c,&_reply) == REDIS_ERR);
        freeReplyObject(reply);
    } else {
        test_cond(reply == NULL);
    }

    /* On 2.0, QUIT will cause the connection to be closed immediately and
     * the read(2) for the reply on QUIT will set the error to EOF.
     * On >2.0, QUIT will return with OK and another read(2) needed to be
     * issued to find out the socket was closed by the server. In both
     * conditions, the error will be set to EOF. */
    assert(c->err == REDIS_ERR_EOF &&
        strcmp(c->errstr,"Server closed the connection") == 0);
    redisFree(c);

    c = do_connect(config);
    test("Returns I/O error on socket timeout: ");
    struct timeval tv = { 0, 1000 };
    assert(redisSetTimeout(c,tv) == REDIS_OK);
    test_cond(redisGetReply(c,&_reply) == REDIS_ERR &&
        c->err == REDIS_ERR_IO && errno == EAGAIN);
    redisFree(c);
}